

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QSize __thiscall QToolBarAreaLayout::minimumSize(QToolBarAreaLayout *this,QSize *centerMin)

{
  QSize QVar1;
  QSize QVar2;
  QSize QVar3;
  QSize QVar4;
  Representation RVar5;
  ulong uVar6;
  Representation RVar7;
  QSize QVar8;
  Representation local_48;
  
  QVar8 = *centerMin;
  uVar6 = (ulong)QVar8 >> 0x20;
  if (this->visible == true) {
    QVar1 = QToolBarAreaLayoutInfo::minimumSize(this->docks);
    QVar2 = QToolBarAreaLayoutInfo::minimumSize(this->docks + 1);
    QVar3 = QToolBarAreaLayoutInfo::minimumSize(this->docks + 2);
    QVar4 = QToolBarAreaLayoutInfo::minimumSize(this->docks + 3);
    RVar7.m_i = QVar8.wd.m_i.m_i;
    if (QVar8.wd.m_i.m_i < QVar3.wd.m_i.m_i) {
      RVar7.m_i = QVar3.wd.m_i.m_i;
    }
    if (RVar7.m_i <= QVar4.wd.m_i.m_i) {
      RVar7.m_i = QVar4.wd.m_i.m_i;
    }
    RVar5.m_i = QVar8.ht.m_i.m_i;
    if (QVar8.ht.m_i.m_i < QVar1.ht.m_i.m_i) {
      RVar5.m_i = QVar1.ht.m_i.m_i;
    }
    if (RVar5.m_i <= QVar2.ht.m_i.m_i) {
      RVar5.m_i = QVar2.ht.m_i.m_i;
    }
    QVar8.wd.m_i = RVar7.m_i + QVar1.wd.m_i.m_i + QVar2.wd.m_i.m_i;
    QVar8.ht.m_i = 0;
    local_48 = QVar3.ht.m_i;
    uVar6 = (ulong)(uint)(QVar4.ht.m_i.m_i + local_48.m_i + RVar5.m_i);
  }
  return (QSize)((ulong)QVar8 & 0xffffffff | uVar6 << 0x20);
}

Assistant:

QSize QToolBarAreaLayout::minimumSize(const QSize &centerMin) const
{
    if (!visible)
        return centerMin;

    QSize result = centerMin;

    QSize left_min = docks[QInternal::LeftDock].minimumSize();
    QSize right_min = docks[QInternal::RightDock].minimumSize();
    QSize top_min = docks[QInternal::TopDock].minimumSize();
    QSize bottom_min = docks[QInternal::BottomDock].minimumSize();

    result.setWidth(qMax(top_min.width(), result.width()));
    result.setWidth(qMax(bottom_min.width(), result.width()));
    result.setHeight(qMax(left_min.height(), result.height()));
    result.setHeight(qMax(right_min.height(), result.height()));

    result.rwidth() += left_min.width() + right_min.width();
    result.rheight() += top_min.height() + bottom_min.height();

    return result;
}